

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

int hts_idx_get_stat(hts_idx_t *idx,int tid,uint64_t *mapped,uint64_t *unmapped)

{
  uint uVar1;
  bidx_t *pbVar2;
  hts_pair64_t *phVar3;
  byte bVar4;
  uint64_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (idx->fmt == 3) {
    *mapped = 0;
    iVar6 = -1;
    uVar5 = 0;
  }
  else {
    pbVar2 = idx->bidx[tid];
    uVar1 = pbVar2->n_buckets;
    if (uVar1 == 0) {
      uVar7 = 0;
LAB_00110982:
      if (uVar7 != uVar1) {
        phVar3 = pbVar2->vals[uVar7].list;
        *mapped = phVar3[1].u;
        uVar5 = phVar3[1].v;
        iVar6 = 0;
        goto LAB_001109ba;
      }
    }
    else {
      uVar8 = idx->n_bins + 1;
      uVar9 = uVar1 - 1 & uVar8;
      iVar6 = 1;
      uVar7 = uVar9;
      do {
        bVar4 = (char)uVar7 * '\x02' & 0x1e;
        uVar10 = pbVar2->flags[uVar7 >> 4] >> bVar4;
        if (((uVar10 & 2) != 0) || (((uVar10 & 1) == 0 && (pbVar2->keys[uVar7] == uVar8)))) {
          if ((pbVar2->flags[uVar7 >> 4] >> bVar4 & 3) != 0) {
            uVar7 = uVar1;
          }
          goto LAB_00110982;
        }
        uVar7 = uVar7 + iVar6 & uVar1 - 1;
        iVar6 = iVar6 + 1;
      } while (uVar7 != uVar9);
    }
    *mapped = 0;
    iVar6 = -1;
    uVar5 = 0;
  }
LAB_001109ba:
  *unmapped = uVar5;
  return iVar6;
}

Assistant:

int hts_idx_get_stat(const hts_idx_t* idx, int tid, uint64_t* mapped, uint64_t* unmapped)
{
    if ( idx->fmt == HTS_FMT_CRAI ) {
        *mapped = 0; *unmapped = 0;
        return -1;
    }

    bidx_t *h = idx->bidx[tid];
    khint_t k = kh_get(bin, h, META_BIN(idx));
    if (k != kh_end(h)) {
        *mapped = kh_val(h, k).list[1].u;
        *unmapped = kh_val(h, k).list[1].v;
        return 0;
    } else {
        *mapped = 0; *unmapped = 0;
        return -1;
    }
}